

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O0

int Option::parseCommandLine(QStringList *args,QMakeCmdLineParserState *state)

{
  bool bVar1;
  bool bVar2;
  const_iterator abegin;
  qsizetype qVar3;
  iterator iVar4;
  const_reference pQVar5;
  char *pcVar6;
  ulong uVar7;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  bool handled;
  ArgumentReturn cmdRet;
  anon_enum_32 argState;
  QString proj;
  QString singleProFileCandidate;
  QFileInfo fi;
  QString arg;
  int x;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  QList<QString> *in_stack_fffffffffffffd30;
  FILE *pFVar8;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  FILE *in_stack_fffffffffffffd40;
  QString *in_stack_fffffffffffffd48;
  FILE *in_stack_fffffffffffffd50;
  bool local_29d;
  bool local_29c;
  bool local_29b;
  bool local_29a;
  bool local_299;
  bool local_289;
  const_iterator in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd90;
  byte in_stack_fffffffffffffd97;
  uint in_stack_fffffffffffffd98;
  ArgumentReturn in_stack_fffffffffffffd9c;
  int local_22c;
  QString local_1c8 [2];
  undefined8 local_198 [4];
  char *local_178;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  QLatin1Char local_6b;
  ushort local_6a;
  QString local_68 [2];
  QString *local_38;
  QString *local_30;
  const_iterator local_28;
  QString *local_20;
  const_iterator local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = false;
  local_c = 0;
  do {
    while( true ) {
      while( true ) {
        abegin.i = (QString *)(long)local_c;
        qVar3 = QList<QString>::size(in_RDI);
        if (qVar3 <= (long)abegin.i) {
          if (bVar1) {
            pFVar8 = _stderr;
            pQVar5 = QList<QString>::at((QList<QString> *)_stderr,
                                        CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
            QtPrivate::asString(pQVar5);
            QString::toLocal8Bit(in_stack_fffffffffffffd48);
            pcVar6 = QByteArray::constData((QByteArray *)0x325997);
            fprintf(pFVar8,"***Option %s requires a parameter\n",pcVar6);
            QByteArray::~QByteArray((QByteArray *)0x3259ba);
            local_22c = 5;
          }
          else {
            local_22c = 0;
          }
          goto LAB_003259d2;
        }
        if (!bVar1) break;
        local_c = local_c + -1;
        QList<QString>::at(in_stack_fffffffffffffd30,
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QFile::setFileName((QString *)output);
        in_stack_fffffffffffffd80.i = (QString *)in_RDI;
        local_20 = (QString *)QList<QString>::begin(in_stack_fffffffffffffd30);
        iVar4 = QList<QString>::iterator::operator+
                          ((iterator *)in_stack_fffffffffffffd30,
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QList<QString>::const_iterator::const_iterator(&local_18,iVar4);
        local_38 = (QString *)QList<QString>::begin(in_stack_fffffffffffffd30);
        local_30 = (QString *)
                   QList<QString>::iterator::operator+
                             ((iterator *)in_stack_fffffffffffffd30,
                              CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        iVar4 = QList<QString>::iterator::operator+
                          ((iterator *)in_stack_fffffffffffffd30,
                           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QList<QString>::const_iterator::const_iterator(&local_28,iVar4);
        QList<QString>::erase
                  ((QList<QString> *)in_stack_fffffffffffffd50,abegin,in_stack_fffffffffffffd80);
        bVar1 = false;
      }
      in_stack_fffffffffffffd9c =
           QMakeGlobals::addCommandLineArguments
                     ((QMakeGlobals *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                      (QMakeCmdLineParserState *)
                      CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                      (QStringList *)abegin.i,(int *)in_stack_fffffffffffffd80.i);
      pFVar8 = _stderr;
      if (in_stack_fffffffffffffd9c == ArgumentMalformed) {
        pQVar5 = QList<QString>::at(in_stack_fffffffffffffd30,
                                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        QtPrivate::asString(pQVar5);
        QString::toLocal8Bit(in_stack_fffffffffffffd48);
        pcVar6 = QByteArray::constData((QByteArray *)0x324db6);
        fprintf(pFVar8,"***Option %s requires a parameter\n",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x324dd9);
        local_22c = 5;
        goto LAB_003259d2;
      }
      bVar2 = QString::isEmpty((QString *)0x324dfc);
      if (!bVar2) {
        QLibraryInfoPrivate::setQtconfManualPath((QString *)&globals->qtconf);
      }
      if (in_stack_fffffffffffffd9c != ArgumentsOk) break;
LAB_00325929:
      local_c = local_c + 1;
    }
    local_68[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_68[0].d.size = -0x5555555555555556;
    QList<QString>::at(in_stack_fffffffffffffd30,
                       CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QString::QString((QString *)in_stack_fffffffffffffd30,
                     (QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    QLatin1Char::QLatin1Char(&local_6b,'-');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffd30,
               (QLatin1Char)(char)(in_stack_fffffffffffffd3c >> 0x18));
    uVar7 = QString::startsWith((QChar)(char16_t)local_68,(uint)local_6a);
    if ((uVar7 & 1) == 0) {
      in_stack_fffffffffffffd97 = 1;
      if (((qmake_mode == QMAKE_QUERY_PROPERTY) || (qmake_mode == QMAKE_SET_PROPERTY)) ||
         (qmake_mode == QMAKE_UNSET_PROPERTY)) {
        QList<QString>::append
                  (in_stack_fffffffffffffd30,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      }
      else {
        local_198[0] = 0xaaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)local_198,(QString *)local_68);
        uVar7 = QFileInfo::makeAbsolute();
        if ((uVar7 & 1) == 0) {
          QFileInfo::filePath();
          QString::operator=((QString *)in_stack_fffffffffffffd30,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
          QString::~QString((QString *)0x32569e);
        }
        if ((qmake_mode == QMAKE_GENERATE_MAKEFILE) || (qmake_mode == QMAKE_GENERATE_PRL)) {
          uVar7 = QFileInfo::isDir();
          if ((uVar7 & 1) == 0) {
            QList<QString>::append
                      (in_stack_fffffffffffffd30,
                       (parameter_type)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                      );
            goto LAB_00325894;
          }
          local_1c8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_1c8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_1c8[0].d.size = -0x5555555555555556;
          QString::QString((QString *)0x325704);
          detectProjectFile((QString *)in_stack_fffffffffffffd40,
                            (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                           );
          bVar2 = QString::isNull((QString *)0x32575b);
          if (bVar2) {
            in_stack_fffffffffffffd40 = _stderr;
            QtPrivate::asString(local_68);
            QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                           );
            in_stack_fffffffffffffd48 = (QString *)QByteArray::constData((QByteArray *)0x32579d);
            QtPrivate::asString(local_1c8);
            QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                           );
            pcVar6 = QByteArray::constData((QByteArray *)0x3257cc);
            fprintf(in_stack_fffffffffffffd40,
                    "***Cannot detect .pro file in directory \'%s\'.\n\nQMake expects the file \'%s\' or exactly one .pro file in the given directory.\n"
                    ,in_stack_fffffffffffffd48,pcVar6);
            QByteArray::~QByteArray((QByteArray *)0x3257f4);
            QByteArray::~QByteArray((QByteArray *)0x325801);
            local_22c = 4;
          }
          else {
            QList<QString>::append
                      (in_stack_fffffffffffffd30,
                       (parameter_type)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                      );
          }
          in_stack_fffffffffffffd3c = (uint)bVar2;
          QString::~QString((QString *)0x32583f);
          QString::~QString((QString *)0x32584c);
          if (in_stack_fffffffffffffd3c == 0) goto LAB_00325894;
        }
        else {
          if (qmake_mode == QMAKE_GENERATE_PROJECT) {
            QList<QString>::append
                      (in_stack_fffffffffffffd30,
                       (parameter_type)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                      );
          }
          else {
            in_stack_fffffffffffffd97 = 0;
          }
LAB_00325894:
          in_stack_fffffffffffffd3c = 0;
        }
        QFileInfo::~QFileInfo((QFileInfo *)local_198);
        if (in_stack_fffffffffffffd3c != 0) goto LAB_003258f8;
      }
      if ((in_stack_fffffffffffffd97 & 1) == 0) {
        local_22c = 5;
        in_stack_fffffffffffffd3c = 1;
      }
      else {
        QList<QString>::removeAt
                  (in_stack_fffffffffffffd30,
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        in_stack_fffffffffffffd3c = 2;
      }
    }
    else {
      local_78 = "-d";
      bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                           (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      if (bVar2) {
        debug_level = debug_level + 1;
        goto LAB_003255f4;
      }
      local_80 = "-v";
      bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                           (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      local_289 = true;
      if (!bVar2) {
        local_88 = "-version";
        bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                             (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
        ;
        local_289 = true;
        if (!bVar2) {
          local_90 = "--version";
          local_289 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                   (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                     in_stack_fffffffffffffd28));
        }
      }
      pFVar8 = _stdout;
      if (local_289 == false) {
        local_c8 = "-h";
        bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                             (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28))
        ;
        local_299 = true;
        if (!bVar2) {
          local_d0 = "-help";
          bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                               (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
          local_299 = true;
          if (!bVar2) {
            local_d8 = "--help";
            local_299 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                     (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                       in_stack_fffffffffffffd28));
          }
        }
        if (local_299 == false) {
          local_e0 = "-Wall";
          bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                               (char **)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28
                                                ));
          if (bVar2) {
            warn_level = warn_level | 0xff;
          }
          else {
            local_e8 = "-Wparser";
            bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                 (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28));
            if (bVar2) {
              warn_level = warn_level | 1;
            }
            else {
              local_f0 = "-Wlogic";
              bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                   (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                     in_stack_fffffffffffffd28));
              if (bVar2) {
                warn_level = warn_level | 2;
              }
              else {
                local_f8 = "-Wdeprecated";
                bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                     (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                       in_stack_fffffffffffffd28));
                if (bVar2) {
                  warn_level = warn_level | 4;
                }
                else {
                  local_100 = "-Wnone";
                  bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                       (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                         in_stack_fffffffffffffd28));
                  if (!bVar2) {
                    local_108 = "-r";
                    bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                         (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                           in_stack_fffffffffffffd28));
                    local_29a = true;
                    if (!bVar2) {
                      local_110 = "-recursive";
                      local_29a = ::operator==((QString *)in_stack_fffffffffffffd30,
                                               (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                 in_stack_fffffffffffffd28));
                    }
                    if (local_29a == false) {
                      local_118 = "-nr";
                      bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                           (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                             in_stack_fffffffffffffd28));
                      local_29b = true;
                      if (!bVar2) {
                        local_120 = "-norecursive";
                        local_29b = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                 (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                   in_stack_fffffffffffffd28));
                      }
                      if (local_29b == false) {
                        local_128 = "-o";
                        bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                             (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                               in_stack_fffffffffffffd28));
                        local_29c = true;
                        if (!bVar2) {
                          local_130 = "-output";
                          local_29c = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                   (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                     in_stack_fffffffffffffd28));
                        }
                        if (local_29c == false) {
                          if ((qmake_mode == QMAKE_GENERATE_MAKEFILE) ||
                             (qmake_mode == QMAKE_GENERATE_PRL)) {
                            local_138 = "-nodepend";
                            bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                 (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                   in_stack_fffffffffffffd28));
                            local_29d = true;
                            if (!bVar2) {
                              local_140 = "-nodepends";
                              local_29d = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                       (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                         in_stack_fffffffffffffd28))
                              ;
                            }
                            if (local_29d == false) {
                              local_148 = "-nomoc";
                              bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                   (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                     in_stack_fffffffffffffd28));
                              if (bVar2) {
                                mkfile::do_mocs = false;
                              }
                              else {
                                local_150 = "-nodependheuristics";
                                bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                     (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                       in_stack_fffffffffffffd28));
                                if (bVar2) {
                                  mkfile::do_dep_heuristics = false;
                                }
                                else {
                                  local_158 = "-E";
                                  bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                       (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                         in_stack_fffffffffffffd28))
                                  ;
                                  pFVar8 = _stderr;
                                  if (!bVar2) {
                                    QString::toLatin1((QString *)
                                                      CONCAT44(in_stack_fffffffffffffd2c,
                                                               in_stack_fffffffffffffd28));
                                    pcVar6 = QByteArray::constData((QByteArray *)0x3254e8);
                                    fprintf(pFVar8,"***Unknown option %s\n",pcVar6);
                                    QByteArray::~QByteArray((QByteArray *)0x32550b);
                                    local_22c = 5;
                                    in_stack_fffffffffffffd3c = 1;
                                    goto LAB_003258f8;
                                  }
                                  mkfile::do_preprocess = true;
                                }
                              }
                            }
                            else {
                              mkfile::do_deps = false;
                            }
                          }
                          else if (qmake_mode == QMAKE_GENERATE_PROJECT) {
                            local_178 = "-nopwd";
                            bVar2 = ::operator==((QString *)in_stack_fffffffffffffd30,
                                                 (char **)CONCAT44(in_stack_fffffffffffffd2c,
                                                                   in_stack_fffffffffffffd28));
                            if (!bVar2) {
                              in_stack_fffffffffffffd50 = _stderr;
                              QString::toLatin1((QString *)
                                                CONCAT44(in_stack_fffffffffffffd2c,
                                                         in_stack_fffffffffffffd28));
                              pcVar6 = QByteArray::constData((QByteArray *)0x32559f);
                              fprintf(in_stack_fffffffffffffd50,"***Unknown option %s\n",pcVar6);
                              QByteArray::~QByteArray((QByteArray *)0x3255c2);
                              local_22c = 5;
                              in_stack_fffffffffffffd3c = 1;
                              goto LAB_003258f8;
                            }
                            projfile::do_pwd = false;
                          }
                        }
                        else {
                          bVar1 = true;
                        }
                        goto LAB_003255f4;
                      }
                      recursive = false;
                      QList<QString>::removeAt
                                (in_stack_fffffffffffffd30,
                                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                      in_stack_fffffffffffffd3c = 2;
                    }
                    else {
                      recursive = true;
                      QList<QString>::removeAt
                                (in_stack_fffffffffffffd30,
                                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
                      in_stack_fffffffffffffd3c = 2;
                    }
                    goto LAB_003258f8;
                  }
                  warn_level = 0;
                }
              }
            }
          }
LAB_003255f4:
          in_stack_fffffffffffffd3c = 0;
        }
        else {
          local_22c = 1;
          in_stack_fffffffffffffd3c = 1;
        }
      }
      else {
        QMakeLibraryInfo::path(in_stack_fffffffffffffd3c);
        QString::toLatin1((QString *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        pcVar6 = QByteArray::constData((QByteArray *)0x324fd3);
        fprintf(pFVar8,"QMake version %s\nUsing Qt version %s in %s\n","3.1","6.10.0",pcVar6);
        QByteArray::~QByteArray((QByteArray *)0x325004);
        QString::~QString((QString *)0x325011);
        local_22c = 2;
        in_stack_fffffffffffffd3c = 1;
      }
    }
LAB_003258f8:
    QString::~QString((QString *)0x325905);
    in_stack_fffffffffffffd98 = in_stack_fffffffffffffd3c;
    if (in_stack_fffffffffffffd3c == 0) goto LAB_00325929;
  } while (in_stack_fffffffffffffd3c != 1);
LAB_003259d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_22c;
}

Assistant:

int
Option::parseCommandLine(QStringList &args, QMakeCmdLineParserState &state)
{
    enum { ArgNone, ArgOutput } argState = ArgNone;
    int x = 0;
    while (x < args.size()) {
        switch (argState) {
        case ArgOutput:
            Option::output.setFileName(args.at(x--));
            args.erase(args.begin() + x, args.begin() + x + 2);
            argState = ArgNone;
            continue;
        default:
            QMakeGlobals::ArgumentReturn cmdRet = globals->addCommandLineArguments(state, args, &x);
            if (cmdRet == QMakeGlobals::ArgumentMalformed) {
                fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
                return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
            }
            if (!globals->qtconf.isEmpty())
                QLibraryInfoPrivate::setQtconfManualPath(&globals->qtconf);
            if (cmdRet == QMakeGlobals::ArgumentsOk)
                break;
            Q_ASSERT(cmdRet == QMakeGlobals::ArgumentUnknown);
            QString arg = args.at(x);
            if (arg.startsWith(QLatin1Char('-'))) {
                if (arg == "-d") {
                    Option::debug_level++;
                } else if (arg == "-v" || arg == "-version" || arg == "--version") {
                    fprintf(stdout,
                            "QMake version %s\n"
                            "Using Qt version %s in %s\n",
                            QMAKE_VERSION_STR, QT_VERSION_STR,
                            QMakeLibraryInfo::path(QLibraryInfo::LibrariesPath)
                                    .toLatin1()
                                    .constData());
#ifdef QMAKE_OPENSOURCE_VERSION
                    fprintf(stdout, "QMake is Open Source software from The Qt Company Ltd and/or its subsidiary(-ies).\n");
#endif
                    return Option::QMAKE_CMDLINE_BAIL;
                } else if (arg == "-h" || arg == "-help" || arg == "--help") {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE;
                } else if (arg == "-Wall") {
                    Option::warn_level |= WarnAll;
                } else if (arg == "-Wparser") {
                    Option::warn_level |= WarnParser;
                } else if (arg == "-Wlogic") {
                    Option::warn_level |= WarnLogic;
                } else if (arg == "-Wdeprecated") {
                    Option::warn_level |= WarnDeprecated;
                } else if (arg == "-Wnone") {
                    Option::warn_level = WarnNone;
                } else if (arg == "-r" || arg == "-recursive") {
                    Option::recursive = true;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-nr" || arg == "-norecursive") {
                    Option::recursive = false;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-o" || arg == "-output") {
                    argState = ArgOutput;
                } else {
                    if (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                        Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if (arg == "-nodepend" || arg == "-nodepends") {
                            Option::mkfile::do_deps = false;
                        } else if (arg == "-nomoc") {
                            Option::mkfile::do_mocs = false;
                        } else if (arg == "-nodependheuristics") {
                            Option::mkfile::do_dep_heuristics = false;
                        } else if (arg == "-E") {
                            Option::mkfile::do_preprocess = true;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    } else if (Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        if (arg == "-nopwd") {
                            Option::projfile::do_pwd = false;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    }
                }
            } else {
                bool handled = true;
                if(Option::qmake_mode == Option::QMAKE_QUERY_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_SET_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_UNSET_PROPERTY) {
                    Option::prop::properties.append(arg);
                } else {
                    QFileInfo fi(arg);
                    if(!fi.makeAbsolute()) //strange
                        arg = fi.filePath();
                    if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                       Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if(fi.isDir()) {
                            QString singleProFileCandidate;
                            QString proj = detectProjectFile(arg, &singleProFileCandidate);
                            if (proj.isNull()) {
                                fprintf(stderr, "***Cannot detect .pro file in directory '%s'.\n\n"
                                        "QMake expects the file '%s' "
                                        "or exactly one .pro file in the given directory.\n",
                                        qUtf8Printable(arg),
                                        qUtf8Printable(singleProFileCandidate));
                                return Option::QMAKE_CMDLINE_ERROR;
                            }
                            Option::mkfile::project_files.append(proj);
                        } else {
                            Option::mkfile::project_files.append(arg);
                        }
                    } else if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        Option::projfile::project_dirs.append(arg);
                    } else {
                        handled = false;
                    }
                }
                if(!handled) {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                }
                args.removeAt(x);
                continue;
            }
        }
        x++;
    }
    if (argState != ArgNone) {
        fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
        return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
    }
    return Option::QMAKE_CMDLINE_SUCCESS;
}